

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepcopy.cpp
# Opt level: O0

int __thiscall
ncnn::DeepCopy::forward(DeepCopy *this,Mat *bottom_blob,Mat *top_blob,Option *param_4)

{
  bool bVar1;
  int in_ECX;
  __fn *in_RSI;
  void *in_R8;
  undefined8 in_R9;
  Mat *in_stack_ffffffffffffff80;
  Mat *in_stack_ffffffffffffff88;
  Mat local_70;
  int local_4;
  
  ncnn::Mat::clone(&local_70,in_RSI,(void *)0x0,in_ECX,in_R8,in_R9,&local_70);
  ncnn::Mat::operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  ncnn::Mat::~Mat((Mat *)0x8efc4c);
  bVar1 = ncnn::Mat::empty(in_stack_ffffffffffffff80);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int DeepCopy::forward(const Mat& bottom_blob, Mat& top_blob, const Option& /*opt*/) const
{
    top_blob = bottom_blob.clone();
    if (top_blob.empty())
        return -100;

    return 0;
}